

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

void __thiscall Frame::changeLocalVariable(Frame *this,Value variableValue,uint32_t index)

{
  ostream *this_00;
  mapped_type *pmVar1;
  uint32_t local_24;
  Frame *pFStack_20;
  uint32_t index_local;
  Frame *this_local;
  Value variableValue_local;
  
  variableValue_local._0_8_ = variableValue.data;
  this_local = variableValue._0_8_;
  local_24 = index;
  pFStack_20 = this;
  if (this->_codeAttribute->max_locals <= index) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Tentando alterar variavel local inexistente");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  pmVar1 = std::
           map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
           ::operator[](&this->_localVariables,&local_24);
  *(Frame **)pmVar1 = this_local;
  pmVar1->data = (anon_union_8_10_52016fac_for_data)variableValue_local._0_8_;
  return;
}

Assistant:

void Frame::changeLocalVariable(Value variableValue, uint32_t index) {
    if (index >= _codeAttribute->max_locals) {
        cerr << "Tentando alterar variavel local inexistente" << endl;
        exit(1);
    }
    
//    if (_localVariables.count(index) > 0 && variableValue.type != _localVariables[index].type) {
//        cerr << "Tentando alterar variavel local com outro tipo" << endl;
//        exit(1);
//    }
    
    _localVariables[index] = variableValue;
}